

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindWindowFocusIndex(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *in_RDI;
  int i;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = (GImGui->WindowsFocusOrder).Size;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) {
      return -1;
    }
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
  } while (*ppIVar1 != in_RDI);
  return iVar2;
}

Assistant:

static int ImGui::FindWindowFocusIndex(ImGuiWindow* window) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.WindowsFocusOrder.Size-1; i >= 0; i--)
        if (g.WindowsFocusOrder[i] == window)
            return i;
    return -1;
}